

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  undefined4 *puVar1;
  uint _h;
  _func_int *p_Var2;
  void *pvVar3;
  size_t sVar4;
  Allocator *pAVar5;
  int *piVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  Layer *pLVar24;
  uint uVar25;
  long lVar26;
  uint _w;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined4 *puVar35;
  undefined4 *puVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  ParamDict pd;
  long local_b0;
  Mat local_78;
  
  pLVar24 = create_layer(0xe);
  this->flatten = pLVar24;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  p_Var2 = this->_vptr_InnerProduct_x86[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x140 + (long)p_Var2) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    _h = *(uint *)(&this->field_0xd0 + (long)p_Var2);
    iVar38 = *(int *)(&this->field_0xd8 + (long)p_Var2);
    _w = iVar38 / (int)_h;
    if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)p_Var2),_w,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        lVar29 = 1;
        lVar39 = 2;
        local_b0 = 3;
        lVar33 = 0;
        uVar30 = 0;
        do {
          lVar26 = (long)(this->weight_data_tm).w;
          pvVar3 = (this->weight_data_tm).data;
          sVar4 = (this->weight_data_tm).elemsize;
          puVar35 = (undefined4 *)((uVar30 >> 2) * lVar26 * sVar4 + (long)pvVar3);
          lVar27 = (long)local_78.w;
          if ((int)_w < 4) {
            lVar27 = local_78.elemsize * lVar27;
            lVar32 = lVar27 * uVar30;
            lVar34 = (uVar30 | 1) * lVar27;
            lVar37 = (uVar30 | 2) * lVar27;
            lVar27 = lVar27 * (uVar30 | 3);
            uVar25 = 0;
          }
          else {
            lVar32 = local_78.elemsize * uVar30 * lVar27;
            lVar34 = local_78.elemsize * lVar29 * lVar27;
            lVar37 = local_78.elemsize * lVar39 * lVar27;
            lVar27 = local_78.elemsize * local_b0 * lVar27;
            iVar38 = 3;
            lVar28 = 0;
            do {
              puVar36 = puVar35;
              puVar1 = (undefined4 *)((long)local_78.data + lVar28 + lVar32);
              uVar7 = puVar1[1];
              uVar8 = puVar1[2];
              uVar9 = puVar1[3];
              puVar35 = (undefined4 *)((long)local_78.data + lVar28 + lVar34);
              uVar10 = *puVar35;
              uVar11 = puVar35[1];
              uVar12 = puVar35[2];
              uVar13 = puVar35[3];
              puVar35 = (undefined4 *)((long)local_78.data + lVar28 + lVar37);
              uVar14 = *puVar35;
              uVar15 = puVar35[1];
              uVar16 = puVar35[2];
              uVar17 = puVar35[3];
              puVar35 = (undefined4 *)((long)local_78.data + lVar28 + lVar27);
              uVar18 = *puVar35;
              uVar19 = puVar35[1];
              uVar20 = puVar35[2];
              uVar21 = puVar35[3];
              puVar35 = (undefined4 *)((long)pvVar3 + lVar28 * 4 + sVar4 * lVar33 * lVar26 + 0x40);
              puVar35[-0x10] = *puVar1;
              puVar35[-0xf] = uVar10;
              puVar35[-0xe] = uVar14;
              puVar35[-0xd] = uVar18;
              puVar35[-0xc] = uVar7;
              puVar35[-0xb] = uVar11;
              puVar35[-10] = uVar15;
              puVar35[-9] = uVar19;
              puVar35[-8] = uVar8;
              puVar35[-7] = uVar12;
              puVar35[-6] = uVar16;
              puVar35[-5] = uVar20;
              puVar35[-4] = uVar9;
              puVar35[-3] = uVar13;
              puVar35[-2] = uVar17;
              puVar35[-1] = uVar21;
              lVar28 = lVar28 + 0x10;
              iVar38 = iVar38 + 4;
            } while (iVar38 < (int)_w);
            puVar35 = puVar36 + 0x10;
            lVar32 = lVar32 + lVar28;
            lVar34 = lVar34 + lVar28;
            lVar37 = lVar37 + lVar28;
            lVar27 = lVar27 + lVar28;
            uVar25 = _w & 0xfffffffc;
          }
          if ((int)uVar25 < (int)_w) {
            lVar26 = 0;
            do {
              *puVar35 = *(undefined4 *)((long)local_78.data + lVar26 * 4 + lVar32);
              puVar35[1] = *(undefined4 *)((long)local_78.data + lVar26 * 4 + lVar34);
              puVar35[2] = *(undefined4 *)((long)local_78.data + lVar26 * 4 + lVar37);
              puVar35[3] = *(undefined4 *)((long)local_78.data + lVar26 * 4 + lVar27);
              puVar35 = puVar35 + 4;
              lVar26 = lVar26 + 1;
            } while (_w - uVar25 != (int)lVar26);
          }
          uVar31 = uVar30 + 7;
          lVar33 = lVar33 + 1;
          lVar29 = lVar29 + 4;
          lVar39 = lVar39 + 4;
          local_b0 = local_b0 + 4;
          uVar30 = uVar30 + 4;
        } while (uVar31 < _h);
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (p_Var2 != (_func_int *)0xfffffffffffffee0) {
      piVar6 = *(int **)(&this->field_0x138 + (long)p_Var2);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_tm).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar3 = (this->weight_data_tm).data;
          pAVar5 = (this->weight_data_tm).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar3,(long)iVar38 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar6 = *(int **)(&this->field_0x138 + (long)p_Var2);
      (this->weight_data_tm).data = ((Mat *)(&this->field_0x130 + (long)p_Var2))->data;
      (this->weight_data_tm).refcount = piVar6;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var2);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var2);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var2);
      uVar22 = *(undefined8 *)(&this->field_0x158 + (long)p_Var2);
      uVar23 = *(undefined8 *)(&this->field_0x160 + (long)p_Var2);
      (this->weight_data_tm).dims = (int)uVar22;
      (this->weight_data_tm).w = (int)((ulong)uVar22 >> 0x20);
      (this->weight_data_tm).h = (int)uVar23;
      (this->weight_data_tm).d = (int)((ulong)uVar23 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var2);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var2);
    }
    if (opt->lightmode == true) {
      p_Var2 = this->_vptr_InnerProduct_x86[-3];
      piVar6 = *(int **)(&this->field_0x138 + (long)p_Var2);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (*(long **)(&this->field_0x150 + (long)p_Var2) == (long *)0x0) {
            if (*(void **)(&this->field_0x130 + (long)p_Var2) != (void *)0x0) {
              free(*(void **)(&this->field_0x130 + (long)p_Var2));
            }
          }
          else {
            (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var2) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x13c + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x144 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x130 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x138 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x160 + (long)p_Var2) = 0;
      *(undefined4 *)(&this->field_0x168 + (long)p_Var2) = 0;
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}